

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ostream *poVar8;
  ostream local_808 [8];
  ofstream beam_radius;
  ostream local_608 [8];
  ofstream beam_radius_2;
  ostream local_408 [8];
  ofstream beam_radius_1;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  string path_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string path;
  double m_rad_9;
  double m_rad_7;
  double m_rad_5;
  double m_rad_3;
  double m_rad_1;
  int e_itra;
  string str_1;
  int good_initiation [20];
  double e;
  int initiation;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string str;
  double r_reg;
  double denesity;
  double dStack_48;
  int num_small_lig;
  double beam_rad;
  double *points_z;
  double *points_y;
  double *points_x;
  int num_itr;
  int num_points;
  int reg_type;
  int num_draw_points;
  double *draw_points;
  
  draw_points._4_4_ = 0;
  _reg_type = (double *)operator_new__(480000000);
  num_points = 0;
  num_itr = 1;
  std::operator<<((ostream *)&std::cout,"What strructure you want in the cube? \n");
  std::operator<<((ostream *)&std::cout,"Enter (1) for  Honeycomb Structure \n");
  std::operator<<((ostream *)&std::cout,"Enter (2) for  Irregular Voronoi Structure \n");
  std::istream::operator>>((istream *)&std::cin,&num_itr);
  points_x._4_4_ = 0x22f;
  std::operator<<((ostream *)&std::cout,
                  "Enter the number of seeds you want inside the unite cube \n");
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&points_x + 4));
  points_x._0_4_ = 1;
  dStack_48 = 0.0;
  denesity._4_4_ = 0;
  str.field_2._8_8_ = min_dist_req_3d(_x0 * _x0 * _x0,points_x._4_4_);
  if (num_itr == 1) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)points_x._4_4_;
    uVar7 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    points_y = (double *)operator_new__(uVar7);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)points_x._4_4_;
    uVar7 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    points_z = (double *)operator_new__(uVar7);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)points_x._4_4_;
    uVar7 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    beam_rad = (double)operator_new__(uVar7);
    regular_points_seeds(points_y,points_z,(double *)beam_rad,(double)str.field_2._8_8_);
    tet_gen_honeycomb(points_x._4_4_,points_y,points_z,(double *)beam_rad,&stack0xffffffffffffffb8,
                      0.03,&num_points,_reg_type);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_80,"../output/00_Drawing.dxf",&local_81);
    std::allocator<char>::~allocator(&local_81);
    draw_cells(_reg_type,num_points,(string *)local_80);
    poVar8 = std::operator<<((ostream *)&std::cout,"beam_rad\t:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,dStack_48);
    poVar8 = std::operator<<(poVar8,"\tinch");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&std::cout,"beam_diameter\t:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,dStack_48 * 0.0254 + dStack_48 * 0.0254);
    poVar8 = std::operator<<(poVar8,"\tm");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    if (points_y != (double *)0x0) {
      operator_delete__(points_y);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    e._0_4_ = 0;
    str_1.field_2._8_8_ = 0x1c00000002;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)points_x._4_4_;
    uVar7 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    points_y = (double *)operator_new__(uVar7);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)points_x._4_4_;
    uVar7 = SUB168(auVar5 * ZEXT816(8),0);
    if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    points_z = (double *)operator_new__(uVar7);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)points_x._4_4_;
    uVar7 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    beam_rad = (double)operator_new__(uVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e_itra,"../output/",(allocator<char> *)((long)&m_rad_1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&m_rad_1 + 7));
    m_rad_1._0_4_ = 0;
    m_rad_3 = 0.0;
    m_rad_5 = 0.0;
    m_rad_7 = 0.0;
    m_rad_9 = 0.0;
    path.field_2._8_8_ = 0;
    for (; e._0_4_ < 0x14; e._0_4_ = e._0_4_ + 1) {
      m_rad_1._0_4_ = 0;
      points_x._0_4_ = 0;
      mps_3d_for_high_regularity
                (points_y,points_z,(double *)beam_rad,points_x._4_4_,(double)str.field_2._8_8_ * 0.9
                 ,(int *)&points_x,good_initiation[(long)e._0_4_ + -2]);
      while (m_rad_1._0_4_ < 5) {
        if (m_rad_1._0_4_ == 0) {
          r_reg = 0.01;
        }
        if (m_rad_1._0_4_ == 1) {
          r_reg = 0.03;
        }
        if (m_rad_1._0_4_ == 2) {
          r_reg = 0.05;
        }
        if (m_rad_1._0_4_ == 3) {
          r_reg = 0.07;
        }
        if (m_rad_1._0_4_ == 4) {
          r_reg = 0.09;
        }
        tet_gen(points_x._4_4_,points_y,points_z,(double *)beam_rad,&stack0xffffffffffffffb8,r_reg,
                (double)str.field_2._8_8_,0.9,e._0_4_,(double)str.field_2._8_8_ * 0.9,
                (int *)((long)&denesity + 4),&num_points,_reg_type);
        if (m_rad_1._0_4_ == 0) {
          m_rad_3 = m_rad_3 + dStack_48;
        }
        if (m_rad_1._0_4_ == 1) {
          m_rad_5 = m_rad_5 + dStack_48;
        }
        if (m_rad_1._0_4_ == 2) {
          m_rad_7 = m_rad_7 + dStack_48;
        }
        if (m_rad_1._0_4_ == 3) {
          m_rad_9 = m_rad_9 + dStack_48;
        }
        if (m_rad_1._0_4_ == 4) {
          path.field_2._8_8_ = (size_type)(path.field_2._8_8_ + dStack_48);
        }
        std::__cxx11::to_string((string *)((long)&path_2.field_2 + 8),e._0_4_);
        std::operator+(&local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_itra,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&path_2.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,&local_188,".dxf");
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)(path_2.field_2._M_local_buf + 8));
        if (m_rad_1._0_4_ == 0) {
          draw_cells(_reg_type,num_points,(string *)local_168);
        }
        std::__cxx11::to_string(&local_208,e._0_4_);
        std::operator+(&local_1e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_itra,
                       &local_208);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,&local_1e8,".txt");
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        if (m_rad_1._0_4_ == 0) {
          std::ofstream::ofstream(local_408,(string *)local_1c8,_S_out);
          poVar8 = std::operator<<(local_408,"denesity\t");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,r_reg);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(local_408,"beam_rad\t");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,dStack_48);
          poVar8 = std::operator<<(poVar8,"\tinch");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(local_408,"num_small_lig\t");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,denesity._4_4_);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(local_408,"regularity\t");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,0.9);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(local_408,"***********************");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::ofstream::~ofstream(local_408);
        }
        else {
          std::ofstream::ofstream(local_608,(string *)local_1c8,_S_app);
          poVar8 = std::operator<<(local_608,"denesity\t");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,r_reg);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(local_608,"beam_rad\t");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,dStack_48);
          poVar8 = std::operator<<(poVar8,"\tinch");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(local_608,"num_small_lig\t");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,denesity._4_4_);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(local_608,"regularity\t");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,0.9);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(local_608,"***********************");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::ofstream::~ofstream(local_608);
        }
        m_rad_1._0_4_ = m_rad_1._0_4_ + 1;
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::string::~string((string *)local_168);
      }
    }
    std::ofstream::ofstream(local_808,"../output/mean_beam_radius.txt",_S_out);
    poVar8 = std::operator<<(local_808,"regularity\t");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0.9);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(local_808,"m_rad_1\t");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,m_rad_3 / (double)e._0_4_);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(local_808,"m_rad_3\t");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,m_rad_5 / (double)e._0_4_);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(local_808,"m_rad_5\t");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,m_rad_7 / (double)e._0_4_);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(local_808,"m_rad_7\t");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,m_rad_9 / (double)e._0_4_);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(local_808,"m_rad_9\t");
    poVar8 = (ostream *)
             std::ostream::operator<<(poVar8,(double)path.field_2._8_8_ / (double)e._0_4_);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    if (points_y != (double *)0x0) {
      operator_delete__(points_y);
    }
    std::ofstream::~ofstream(local_808);
    std::__cxx11::string::~string((string *)&e_itra);
  }
  return 0;
}

Assistant:

int main()
{
	// creat array that holds voroni vertices
	double *draw_points;
	draw_points = new double[60000000];
	int num_draw_points = 0;

	//Create a parameter to check whether the user want to generate a honeycomb structure 1 or random voronoi diagram
	int reg_type = 1;
	cout << "What strructure you want in the cube? \n";
	cout << "Enter (1) for  Honeycomb Structure \n";
	cout << "Enter (2) for  Irregular Voronoi Structure \n";
	cin >> reg_type;

	//the required number of seed inside the unite cube
	int num_points = 559;
	cout << "Enter the number of seeds you want inside the unite cube \n";
	cin >> num_points;

	int num_itr = 1;
	double *points_x, *points_y, *points_z;

	// Create variables that holds Vornoi ligaments characteristics
	double beam_rad = 0.0;
	int num_small_lig = 0;
	double denesity;

	// calculate the required distance to generate complete regulare voronoi structure for "num_points" seeds in unite cube "_x0*_x0*_x0"
	double r_reg;
	r_reg = min_dist_req_3d(_x0 * _x0 * _x0, num_points);

	//in case of user want to generate complete regulare structure "honeycomb"
	if (reg_type == 1)
	{
		// set the the required density of model
		denesity = 0.03;

		// Create arrays holds seeds coordinates
		points_x = new double[num_points];
		points_y = new double[num_points];
		points_z = new double[num_points];

		// generate regulare distribution seeds
		regular_points_seeds(points_x, points_y, points_z, r_reg);

		// Creating Vornoi vertices for honeycomb structure using TetGen library
		tet_gen_honeycomb(num_points, points_x, points_y, points_z, beam_rad, denesity, num_draw_points, draw_points);

		//set the destination for storing DXF file
		string str = "../output/00_Drawing.dxf";

		// Draw Honeycomb structure in dxf file
		draw_cells(draw_points, num_draw_points, str);

		//display voronoi ligaments radiaus in inch and in m
		cout << "beam_rad	:" << beam_rad << "	inch" << endl;
		cout << "beam_diameter	:" << beam_rad * .0254 * 2 << "	m" << endl;

		delete[] points_x, points_y, points_z;
	}
	//in case of user want to generete random distributing voronoi
	else
	{
		// random number geration function initiation
		int initiation = 0;

		//Regularity parameter 0 % complete irrigulare structure and 100% is honeycomb structure
		double e = 0.9;

		//these values are evaluated from running the code before. the code converge more quicly when srand() functions initiated with these values
		int good_initiation[20] = {2, 28, 29, 37, 45, 56, 70, 95, 104, 126, 162, 178, 205, 229, 243, 268, 309, 322, 326, 357};

		//create arrays holps seeds coordinates
		points_x = new double[num_points];
		points_y = new double[num_points];
		points_z = new double[num_points];

		//location where the Dxf file and statistics .txt will be stored
		string str = "../output/";

		// this variable will hold density itration
		int e_itra = 0;
		double m_rad_1 = 0.0, m_rad_3 = 0.0, m_rad_5 = 0.0, m_rad_7 = 0.0, m_rad_9 = 0.0;

		//we need to generate 20 model automatically and store them in different distinations
		while (initiation < 20)
		{
			e_itra = 0;
			num_itr = 0;

			//use the modified MPS to generate vornoi with regularity 90%
			mps_3d_for_high_regularity(points_x, points_y, points_z, num_points, e * r_reg, num_itr, good_initiation[initiation]);
			//mps_3d(points_x,points_y,points_z, num_points, e*r_reg,num_itr,initiation);

			while (e_itra < 5)
			{
				if (e_itra == 0)
					denesity = .01;
				if (e_itra == 1)
					denesity = .03;
				if (e_itra == 2)
					denesity = .05;
				if (e_itra == 3)
					denesity = .07;
				if (e_itra == 4)
					denesity = .09;

				// Get Vornoi vertices using TetGen library
				tet_gen(num_points, points_x, points_y, points_z, beam_rad, denesity, r_reg, e, initiation, e * r_reg, num_small_lig, num_draw_points, draw_points);

				// sum the beam diameter for every density and at the end calculate the mean for 20 model
				if (e_itra == 0)
					m_rad_1 = m_rad_1 + beam_rad;
				if (e_itra == 1)
					m_rad_3 = m_rad_3 + beam_rad;
				if (e_itra == 2)
					m_rad_5 = m_rad_5 + beam_rad;
				if (e_itra == 3)
					m_rad_7 = m_rad_7 + beam_rad;
				if (e_itra == 4)
					m_rad_9 = m_rad_9 + beam_rad;

				// Draw Voronoi Seeds for the first itration of densities as the structure will not change by changing densities
				// only Vornoi legaments diameter will change
				string path = str + to_string(initiation) + ".dxf";
				if (e_itra == 0)
					draw_cells(draw_points, num_draw_points, path);

				string path_2 = str + to_string(initiation) + ".txt";

				if (e_itra == 0)
				{
					ofstream beam_radius(path_2, ios::out);
					beam_radius << "denesity	" << denesity << endl;
					beam_radius << "beam_rad	" << beam_rad << "	inch" << endl;
					beam_radius << "num_small_lig	" << num_small_lig << endl;
					beam_radius << "regularity	" << e << endl;
					beam_radius << "***********************" << endl;
				}

				else
				{
					ofstream beam_radius(path_2, ios::app);
					beam_radius << "denesity	" << denesity << endl;
					beam_radius << "beam_rad	" << beam_rad << "	inch" << endl;
					beam_radius << "num_small_lig	" << num_small_lig << endl;
					beam_radius << "regularity	" << e << endl;
					beam_radius << "***********************" << endl;
				}

				e_itra++;
			}
			initiation++;
		}

		// calculate the mean of Voronoi ligaments for 20 model and store them in dxf file
		ofstream beam_radius("../output/mean_beam_radius.txt", ios::out);
		beam_radius << "regularity	" << e << endl;
		beam_radius << "m_rad_1	" << m_rad_1 / initiation << endl;
		beam_radius << "m_rad_3	" << m_rad_3 / initiation << endl;
		beam_radius << "m_rad_5	" << m_rad_5 / initiation << endl;
		beam_radius << "m_rad_7	" << m_rad_7 / initiation << endl;
		beam_radius << "m_rad_9	" << m_rad_9 / initiation << endl;

		delete[] points_x, points_y, points_z;
	}
	return 0;
}